

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O1

void __thiscall libtorrent::aux::piece_picker::we_dont_have(piece_picker *this,piece_index_t index)

{
  piece_pos *this_00;
  pointer ppVar1;
  download_queue_t queue;
  int iVar2;
  iterator i;
  
  ppVar1 = (this->m_piece_map).
           super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
           .
           super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = ppVar1 + index.m_val;
  if ((this_00->index).m_val == -1) {
    this->m_num_passed = this->m_num_passed + -1;
    if (*(uint *)this_00 < 0x20000000) {
      iVar2 = pad_bytes_in_piece(this,index);
      this->m_filtered_pad_bytes = this->m_filtered_pad_bytes + (long)iVar2;
      this->m_num_filtered = this->m_num_filtered + 1;
      iVar2 = pad_bytes_in_piece(this,index);
      this->m_have_filtered_pad_bytes = this->m_have_filtered_pad_bytes - (long)iVar2;
      this->m_num_have_filtered = this->m_num_have_filtered + -1;
    }
    else if ((this->m_reverse_cursor).m_val == (this->m_cursor).m_val) {
      (this->m_reverse_cursor).m_val = 0;
      (this->m_cursor).m_val =
           (int)((ulong)((long)(this->m_piece_map).
                               super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                               .
                               super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) >> 3);
    }
    this->m_num_have = this->m_num_have + -1;
    iVar2 = pad_bytes_in_piece(this,index);
    this->m_have_pad_bytes = this->m_have_pad_bytes - (long)iVar2;
    (this_00->index).m_val = 0;
    if (this->m_dirty == false) {
      iVar2 = piece_pos::priority(this_00,this);
      if (-1 < iVar2) {
        add(this,index);
        return;
      }
    }
  }
  else {
    queue.m_val = (byte)(*(uint *)this_00 >> 0x1a) & 7;
    if (queue.m_val == 5) {
      queue.m_val = '\0';
    }
    else if ((*(uint *)this_00 >> 0x1a & 7) == 6) {
      queue.m_val = '\x01';
    }
    if (queue.m_val != '\x04') {
      i = find_dl_piece(this,queue,index);
      if ((short)*(uint *)&(i._M_current)->field_0x6 < 0) {
        *(uint *)&(i._M_current)->field_0x6 = *(uint *)&(i._M_current)->field_0x6 & 0xffff7fff;
        this->m_num_passed = this->m_num_passed + -1;
      }
      erase_download_piece(this,i);
      return;
    }
  }
  return;
}

Assistant:

void piece_picker::we_dont_have(piece_index_t const index)
	{
		INVARIANT_CHECK;
		piece_pos& p = m_piece_map[index];

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "piece_picker::we_dont_have("
			<< index << ")" << std::endl;
#endif

		if (!p.have())
		{
			// even though we don't have the piece, it
			// might still have passed hash check
			auto const download_state = p.download_queue();
			if (download_state == piece_pos::piece_open) return;

			auto const i = find_dl_piece(download_state, index);
			if (i->passed_hash_check)
			{
				i->passed_hash_check = false;
				TORRENT_ASSERT(m_num_passed > 0);
				--m_num_passed;
			}
			erase_download_piece(i);
			return;
		}

		TORRENT_ASSERT(m_num_passed > 0);
		--m_num_passed;
		if (p.filtered())
		{
			m_filtered_pad_bytes += pad_bytes_in_piece(index);
			++m_num_filtered;

			TORRENT_ASSERT(m_have_filtered_pad_bytes >= pad_bytes_in_piece(index));
			m_have_filtered_pad_bytes -= pad_bytes_in_piece(index);
			TORRENT_ASSERT(m_num_have_filtered > 0);
			--m_num_have_filtered;
		}
		else
		{
			// update cursors
			if (m_reverse_cursor == m_cursor)
			{
				m_reverse_cursor = piece_index_t(0);
				m_cursor = m_piece_map.end_index();
			}
		}

		--m_num_have;
		m_have_pad_bytes -= pad_bytes_in_piece(index);
		TORRENT_ASSERT(m_have_pad_bytes >= 0);
		p.set_not_have();

		if (m_dirty) return;
		if (p.priority(this) >= 0) add(index);
	}